

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O0

void __thiscall QuickImpl::~QuickImpl(QuickImpl *this)

{
  pointer pPVar1;
  pointer this_00;
  QuickImpl *this_local;
  
  (this->super_Quick)._vptr_Quick = (_func_int **)&PTR_ConnectToServer_001c07b8;
  LogWrapper::Close(&g_quic_log);
  pPVar1 = std::unique_ptr<dd::ProcessThread,_std::default_delete<dd::ProcessThread>_>::operator->
                     (&this->_paced_thread);
  (*(pPVar1->super_TaskQueueBase)._vptr_TaskQueueBase[6])();
  this_00 = std::unique_ptr<AckThread,_std::default_delete<AckThread>_>::operator->
                      (&this->_ack_thread_impl);
  AckThread::StopThread(this_00);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->(&this->_ack_thread);
  std::thread::join();
  std::unique_ptr<AckThread,_std::default_delete<AckThread>_>::~unique_ptr(&this->_ack_thread_impl);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&this->_ack_thread);
  dd::Lock::~Lock(&this->_quick_lock);
  std::
  unordered_map<unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>_>
  ::~unordered_map(&this->_connections);
  std::unique_ptr<UdpSocket,_std::default_delete<UdpSocket>_>::~unique_ptr(&this->_udp_socket);
  std::unique_ptr<PacketReader,_std::default_delete<PacketReader>_>::~unique_ptr
            (&this->_packet_reader);
  std::unique_ptr<dd::ProcessThread,_std::default_delete<dd::ProcessThread>_>::~unique_ptr
            (&this->_paced_thread);
  dd::TaskQueue::~TaskQueue(&this->_task_queue);
  std::unique_ptr<dd::TaskQueueFactory,_std::default_delete<dd::TaskQueueFactory>_>::~unique_ptr
            (&this->_task_queue_factory);
  return;
}

Assistant:

QuickImpl::~QuickImpl()
{
	g_quic_log.Close();
	_paced_thread->Stop();

	_ack_thread_impl->StopThread();
	_ack_thread->join();
}